

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_mdtm_resp(Curl_easy *data,int ftpcode)

{
  uchar uVar1;
  int iVar2;
  time_t tVar3;
  undefined4 *puVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 *puVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int local_15c;
  tm *tm;
  tm buffer;
  time_t filetime;
  char local_f8 [4];
  int headerbuflen;
  char headerbuf [128];
  char timebuf [24];
  undefined4 local_58;
  undefined4 local_54;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  int ftpcode_local;
  Curl_easy *data_local;
  
  ftp._0_4_ = CURLE_OK;
  conn = (connectdata *)(data->req).p.file;
  ftpc = (ftp_conn *)data->conn;
  _month = &((connectdata *)ftpc)->proto;
  ftp._4_4_ = ftpcode;
  _result = data;
  if (ftpcode == 0xd5) {
    puVar4 = &local_54;
    puVar7 = &local_58;
    iVar2 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&day,&hour,&minute,
                            &second,puVar4,puVar7);
    uVar9 = (undefined4)((ulong)puVar7 >> 0x20);
    uVar6 = (undefined4)((ulong)puVar4 >> 0x20);
    if (iVar2 == 6) {
      uVar5 = CONCAT44(uVar6,second);
      uVar8 = CONCAT44(uVar9,local_54);
      curl_msnprintf(headerbuf + 0x78,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)day,
                     (ulong)(uint)hour,(ulong)(uint)minute,uVar5,uVar8,local_58);
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      tVar3 = Curl_getdate_capped(headerbuf + 0x78);
      (_result->info).filetime = tVar3;
    }
    if (((((*(ulong *)&(_result->set).field_0x8e2 >> 0x19 & 1) != 0) &&
         ((_month->ftpc).file != (char *)0x0)) &&
        ((*(ulong *)&(_result->set).field_0x8e2 >> 5 & 1) != 0)) && (-1 < (_result->info).filetime))
    {
      buffer.tm_zone = (char *)(_result->info).filetime;
      ftp._0_4_ = Curl_gmtime((time_t)buffer.tm_zone,(tm *)&tm);
      if ((CURLcode)ftp != CURLE_OK) {
        return (CURLcode)ftp;
      }
      if (buffer.tm_mon == 0) {
        local_15c = 6;
      }
      else {
        local_15c = buffer.tm_mon + -1;
      }
      iVar2 = curl_msnprintf(local_f8,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                             Curl_wkday[local_15c],(ulong)(uint)buffer.tm_min,
                             Curl_month[buffer.tm_hour],CONCAT44(uVar6,buffer.tm_mday + 0x76c),
                             CONCAT44(uVar9,buffer.tm_sec),tm._4_4_,tm._0_4_);
      ftp._0_4_ = Curl_client_write(_result,3,local_f8,(long)iVar2);
      if ((CURLcode)ftp != CURLE_OK) {
        return (CURLcode)ftp;
      }
    }
  }
  else if (ftpcode == 0x226) {
    Curl_infof(data,"MDTM failed: file does not exist or permission problem, continuing");
  }
  else {
    Curl_infof(data,"unsupported MDTM reply format");
  }
  if ((_result->set).timecondition != '\0') {
    if (((_result->info).filetime < 1) || ((_result->set).timevalue < 1)) {
      Curl_infof(_result,"Skipping time comparison");
    }
    else {
      uVar1 = (_result->set).timecondition;
      if ((uVar1 == '\x01') || (uVar1 != '\x02')) {
        if ((_result->info).filetime <= (_result->set).timevalue) {
          Curl_infof(_result,"The requested document is not new enough");
          *(undefined4 *)&(conn->cnnct).outp = 2;
          (_result->info).field_0xec = (_result->info).field_0xec & 0xfe | 1;
          _state(_result,FTP_STOP);
          return CURLE_OK;
        }
      }
      else if ((_result->set).timevalue < (_result->info).filetime) {
        Curl_infof(_result,"The requested document is not old enough");
        *(undefined4 *)&(conn->cnnct).outp = 2;
        (_result->info).field_0xec = (_result->info).field_0xec & 0xfe | 1;
        _state(_result,FTP_STOP);
        return CURLE_OK;
      }
    }
  }
  if ((CURLcode)ftp == CURLE_OK) {
    ftp._0_4_ = ftp_state_type(_result);
  }
  return (CURLcode)ftp;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = Curl_getdate_capped(timebuf);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        int headerbuflen;
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        headerbuflen = msnprintf(headerbuf, sizeof(headerbuf),
                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                  Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                  tm->tm_mday,
                  Curl_month[tm->tm_mon],
                  tm->tm_year + 1900,
                  tm->tm_hour,
                  tm->tm_min,
                  tm->tm_sec);
        result = Curl_client_write(data, CLIENTWRITE_BOTH, headerbuf,
                                   headerbuflen);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format");
    break;
  case 550: /* 550 is used for several different problems, e.g.
               "No such file or directory" or "Permission denied".
               It does not mean that the file does not exist at all. */
    infof(data, "MDTM failed: file does not exist or permission problem,"
          " continuing");
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough");
          ftp->transfer = PPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(data, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison");
    }
  }

  if(!result)
    result = ftp_state_type(data);

  return result;
}